

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileImporter::createMaterials(ObjFileImporter *this,Model *pModel,aiScene *pScene)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  ulong uVar6;
  aiMaterial **ppaVar7;
  const_reference __x;
  aiMaterial *this_00;
  reference ppVar8;
  Logger *pLVar9;
  uint local_74;
  uint i;
  uint count;
  TextureType type;
  int uvwIndex;
  int sm;
  Material *pCurrentMaterial;
  aiMaterial *local_48;
  aiMaterial *mat;
  _Base_ptr local_38;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>
  local_30;
  const_iterator it;
  uint matIndex;
  uint numMaterials;
  aiScene *pScene_local;
  Model *pModel_local;
  ObjFileImporter *this_local;
  
  if (pScene != (aiScene *)0x0) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pModel->m_MaterialLib);
    it._M_node._4_4_ = (uint)sVar5;
    pScene->mNumMaterials = 0;
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pModel->m_MaterialLib);
    if (bVar2) {
      pLVar9 = DefaultLogger::get();
      Logger::debug(pLVar9,"OBJ: no materials specified");
    }
    else {
      uVar6 = SUB168(ZEXT416(it._M_node._4_4_) * ZEXT816(8),0);
      if (SUB168(ZEXT416(it._M_node._4_4_) * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      ppaVar7 = (aiMaterial **)operator_new__(uVar6);
      pScene->mMaterials = ppaVar7;
      for (it._M_node._0_4_ = 0; (uint)it._M_node < it._M_node._4_4_;
          it._M_node._0_4_ = (uint)it._M_node + 1) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>
        ::_Rb_tree_const_iterator(&local_30);
        __x = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&pModel->m_MaterialLib,(ulong)(uint)it._M_node);
        local_38 = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
                   ::find(&pModel->m_MaterialMap,__x);
        local_30._M_node = local_38;
        mat = (aiMaterial *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
              ::end(&pModel->m_MaterialMap);
        bVar2 = std::operator==((_Self *)&mat,&local_30);
        if (!bVar2) {
          this_00 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_00);
          local_48 = this_00;
          ppVar8 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>
                   ::operator*(&local_30);
          _uvwIndex = ppVar8->second;
          aiMaterial::AddProperty(local_48,&_uvwIndex->MaterialName,"?mat.name",0,0);
          iVar1 = _uvwIndex->illumination_model;
          if (iVar1 == 0) {
            type = TextureReflectionCubeFrontType;
          }
          else if (iVar1 == 1) {
            type = TextureAmbientType;
          }
          else if (iVar1 == 2) {
            type = TextureEmissiveType;
          }
          else {
            type = TextureAmbientType;
            pLVar9 = DefaultLogger::get();
            Logger::error(pLVar9,"OBJ: unexpected illumination model (0-2 recognized)");
          }
          aiMaterial::AddProperty<int>(local_48,(int *)&type,1,"$mat.shadingm",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->ambient,1,"$clr.ambient",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->diffuse,1,"$clr.diffuse",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->specular,1,"$clr.specular",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->emissive,1,"$clr.emissive",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->shineness,1,"$mat.shininess",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->alpha,1,"$mat.opacity",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->transparent,1,"$clr.transparent",0,0);
          aiMaterial::AddProperty(local_48,&_uvwIndex->ior,1,"$mat.refracti",0,0);
          count = 0;
          if ((_uvwIndex->texture).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->texture,"$tex.file",1,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",1,0);
            if ((_uvwIndex->clamp[0] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_DIFFUSE,1,0);
            }
          }
          if ((_uvwIndex->textureAmbient).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureAmbient,"$tex.file",3,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",3,0);
            if ((_uvwIndex->clamp[2] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_AMBIENT,1,0);
            }
          }
          if ((_uvwIndex->textureEmissive).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureEmissive,"$tex.file",4,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",4,0);
          }
          if ((_uvwIndex->textureSpecular).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureSpecular,"$tex.file",2,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",2,0);
            if ((_uvwIndex->clamp[1] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_SPECULAR,1,0);
            }
          }
          if ((_uvwIndex->textureBump).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureBump,"$tex.file",5,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",5,0);
            if ((_uvwIndex->clamp[4] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_HEIGHT,1,0);
            }
          }
          if ((_uvwIndex->textureNormal).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureNormal,"$tex.file",6,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",6,0);
            if ((_uvwIndex->clamp[5] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_NORMALS,1,0);
            }
          }
          if (_uvwIndex->textureReflection[0].length != 0) {
            uVar3 = 6;
            if (_uvwIndex->textureReflection[1].length != 0) {
              uVar3 = 7;
            }
            uVar4 = 6;
            if (uVar3 == 6) {
              uVar4 = 1;
            }
            for (local_74 = 0; local_74 < uVar4; local_74 = local_74 + 1) {
              aiMaterial::AddProperty
                        (local_48,_uvwIndex->textureReflection + local_74,"$tex.file",0xb,local_74);
              aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",0xb,local_74);
              if ((_uvwIndex->clamp[uVar3] & 1U) != 0) {
                addTextureMappingModeProperty(this,local_48,aiTextureType_REFLECTION,1,local_74);
              }
            }
          }
          if ((_uvwIndex->textureDisp).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureDisp,"$tex.file",9,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",9,0);
            if ((_uvwIndex->clamp[0xf] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_DISPLACEMENT,1,0);
            }
          }
          if ((_uvwIndex->textureOpacity).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureOpacity,"$tex.file",8,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",8,0);
            if ((_uvwIndex->clamp[0xe] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_OPACITY,1,0);
            }
          }
          if ((_uvwIndex->textureSpecularity).length != 0) {
            aiMaterial::AddProperty(local_48,&_uvwIndex->textureSpecularity,"$tex.file",7,0);
            aiMaterial::AddProperty(local_48,(int *)&count,1,"$tex.uvwsrc",7,0);
            if ((_uvwIndex->clamp[0xd] & 1U) != 0) {
              addTextureMappingModeProperty(this,local_48,aiTextureType_SHININESS,1,0);
            }
          }
          pScene->mMaterials[pScene->mNumMaterials] = local_48;
          pScene->mNumMaterials = pScene->mNumMaterials + 1;
        }
      }
      if (pScene->mNumMaterials != it._M_node._4_4_) {
        __assert_fail("pScene->mNumMaterials == numMaterials",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                      ,0x2f9,
                      "void Assimp::ObjFileImporter::createMaterials(const ObjFile::Model *, aiScene *)"
                     );
      }
    }
  }
  return;
}

Assistant:

void ObjFileImporter::createMaterials(const ObjFile::Model* pModel, aiScene* pScene ) {
    if ( NULL == pScene ) {
        return;
    }

    const unsigned int numMaterials = (unsigned int) pModel->m_MaterialLib.size();
    pScene->mNumMaterials = 0;
    if ( pModel->m_MaterialLib.empty() ) {
        ASSIMP_LOG_DEBUG("OBJ: no materials specified");
        return;
    }

    pScene->mMaterials = new aiMaterial*[ numMaterials ];
    for ( unsigned int matIndex = 0; matIndex < numMaterials; matIndex++ )
    {
        // Store material name
        std::map<std::string, ObjFile::Material*>::const_iterator it;
        it = pModel->m_MaterialMap.find( pModel->m_MaterialLib[ matIndex ] );

        // No material found, use the default material
        if ( pModel->m_MaterialMap.end() == it )
            continue;

        aiMaterial* mat = new aiMaterial;
        ObjFile::Material *pCurrentMaterial = (*it).second;
        mat->AddProperty( &pCurrentMaterial->MaterialName, AI_MATKEY_NAME );

        // convert illumination model
        int sm = 0;
        switch (pCurrentMaterial->illumination_model)
        {
        case 0:
            sm = aiShadingMode_NoShading;
            break;
        case 1:
            sm = aiShadingMode_Gouraud;
            break;
        case 2:
            sm = aiShadingMode_Phong;
            break;
        default:
            sm = aiShadingMode_Gouraud;
            ASSIMP_LOG_ERROR("OBJ: unexpected illumination model (0-2 recognized)");
        }

        mat->AddProperty<int>( &sm, 1, AI_MATKEY_SHADING_MODEL);

        // Adding material colors
        mat->AddProperty( &pCurrentMaterial->ambient, 1, AI_MATKEY_COLOR_AMBIENT );
        mat->AddProperty( &pCurrentMaterial->diffuse, 1, AI_MATKEY_COLOR_DIFFUSE );
        mat->AddProperty( &pCurrentMaterial->specular, 1, AI_MATKEY_COLOR_SPECULAR );
        mat->AddProperty( &pCurrentMaterial->emissive, 1, AI_MATKEY_COLOR_EMISSIVE );
        mat->AddProperty( &pCurrentMaterial->shineness, 1, AI_MATKEY_SHININESS );
        mat->AddProperty( &pCurrentMaterial->alpha, 1, AI_MATKEY_OPACITY );
        mat->AddProperty( &pCurrentMaterial->transparent,1,AI_MATKEY_COLOR_TRANSPARENT);

        // Adding refraction index
        mat->AddProperty( &pCurrentMaterial->ior, 1, AI_MATKEY_REFRACTI );

        // Adding textures
        const int uvwIndex = 0;

        if ( 0 != pCurrentMaterial->texture.length )
        {
            mat->AddProperty( &pCurrentMaterial->texture, AI_MATKEY_TEXTURE_DIFFUSE(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_DIFFUSE(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureDiffuseType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_DIFFUSE);
            }
        }

        if ( 0 != pCurrentMaterial->textureAmbient.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureAmbient, AI_MATKEY_TEXTURE_AMBIENT(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_AMBIENT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureAmbientType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_AMBIENT);
            }
        }

        if ( 0 != pCurrentMaterial->textureEmissive.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureEmissive, AI_MATKEY_TEXTURE_EMISSIVE(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_EMISSIVE(0) );
        }

        if ( 0 != pCurrentMaterial->textureSpecular.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureSpecular, AI_MATKEY_TEXTURE_SPECULAR(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_SPECULAR(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureSpecularType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_SPECULAR);
            }
        }

        if ( 0 != pCurrentMaterial->textureBump.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureBump, AI_MATKEY_TEXTURE_HEIGHT(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_HEIGHT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureBumpType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_HEIGHT);
            }
        }

        if ( 0 != pCurrentMaterial->textureNormal.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureNormal, AI_MATKEY_TEXTURE_NORMALS(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_NORMALS(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureNormalType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_NORMALS);
            }
        }

        if( 0 != pCurrentMaterial->textureReflection[0].length )
        {
            ObjFile::Material::TextureType type = 0 != pCurrentMaterial->textureReflection[1].length ?
                ObjFile::Material::TextureReflectionCubeTopType :
                ObjFile::Material::TextureReflectionSphereType;

            unsigned count = type == ObjFile::Material::TextureReflectionSphereType ? 1 : 6;
            for( unsigned i = 0; i < count; i++ )
            {
                mat->AddProperty(&pCurrentMaterial->textureReflection[i], AI_MATKEY_TEXTURE_REFLECTION(i));
                mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_REFLECTION(i) );

                if(pCurrentMaterial->clamp[type])
                    addTextureMappingModeProperty(mat, aiTextureType_REFLECTION, 1, i);
            }
        }

        if ( 0 != pCurrentMaterial->textureDisp.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureDisp, AI_MATKEY_TEXTURE_DISPLACEMENT(0) );
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_DISPLACEMENT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureDispType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_DISPLACEMENT);
            }
        }

        if ( 0 != pCurrentMaterial->textureOpacity.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureOpacity, AI_MATKEY_TEXTURE_OPACITY(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_OPACITY(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureOpacityType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_OPACITY);
            }
        }

        if ( 0 != pCurrentMaterial->textureSpecularity.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureSpecularity, AI_MATKEY_TEXTURE_SHININESS(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_SHININESS(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureSpecularityType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_SHININESS);
            }
        }

        // Store material property info in material array in scene
        pScene->mMaterials[ pScene->mNumMaterials ] = mat;
        pScene->mNumMaterials++;
    }

    // Test number of created materials.
    ai_assert( pScene->mNumMaterials == numMaterials );
}